

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          string *config,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  bool bVar1;
  reference ppcVar2;
  reference pcVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_50;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_48;
  const_iterator lib;
  cmLinkInterface *iface;
  cmGeneratorTarget *depender;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emitted_local;
  string *config_local;
  cmGeneratorTarget *dependee_local;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  lib._M_current = (cmLinkItem *)cmGeneratorTarget::GetLinkInterface(dependee,config,*ppcVar2);
  if ((cmLinkInterface *)lib._M_current != (cmLinkInterface *)0x0) {
    local_48._M_current =
         (cmLinkItem *)
         std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                   ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)lib._M_current);
    while( true ) {
      local_50._M_current =
           (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(lib._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar1) break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&local_48);
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(emitted,&pcVar3->super_string);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&local_48);
        AddTargetDepend(this,depender_index,pcVar3,true);
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&local_48);
        AddInterfaceDepends(this,depender_index,pcVar3,config,emitted);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&local_48);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, const cmGeneratorTarget* dependee,
  const std::string& config, std::set<std::string>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (std::vector<cmLinkItem>::const_iterator lib =
           iface->Libraries.begin();
         lib != iface->Libraries.end(); ++lib) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(*lib).second) {
        this->AddTargetDepend(depender_index, *lib, true);
        this->AddInterfaceDepends(depender_index, *lib, config, emitted);
      }
    }
  }
}